

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *this)

{
  unique_ptr<int,_std::default_delete<int>_> *this_00;
  ulong capacity;
  undefined1 auVar1 [16];
  allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *alloc;
  size_t pos;
  size_t sVar2;
  size_t sVar3;
  byte bVar4;
  size_t new_capacity;
  FindInfo FVar5;
  size_t hashval;
  allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *local_50;
  type raw;
  anon_class_16_2_f7bee600 probe_index;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash, Eq, std::allocator<std::unique_ptr<int>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash = Hash, Eq = Eq, Alloc = std::allocator<std::unique_ptr<int>>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash, Eq, std::allocator<std::unique_ptr<int>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash = Hash, Eq = Eq, Alloc = std::allocator<std::unique_ptr<int>>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  local_50 = (allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)&this->settings_;
  new_capacity = 0;
  do {
    if (new_capacity == this->capacity_) {
      reset_growth_left(this,new_capacity);
      return;
    }
    if (this->ctrl_[new_capacity] == -2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)*this->slots_[new_capacity]._M_t.
                            super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl;
      hashval = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar5 = find_first_non_full(this,hashval);
      pos = FVar5.offset;
      probe_index.this = this;
      probe_index.hashval = &hashval;
      sVar2 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()(&probe_index,pos);
      sVar3 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                        (&probe_index,new_capacity);
      bVar4 = (byte)hashval;
      if (sVar2 == sVar3) {
        bVar4 = bVar4 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar4 & 0x7f);
          this_00 = this->slots_ + new_capacity;
          raw.data = (uchar  [8])
                     (this_00->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl;
          (this_00->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
          std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(this_00);
          alloc = local_50;
          FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>::
          transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                    (local_50,this->slots_ + new_capacity,this->slots_ + pos);
          FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>::
          transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                    (alloc,this->slots_ + pos,(slot_type *)&raw);
          new_capacity = new_capacity - 1;
          goto LAB_00120de7;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x853,
                        "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash, Eq, std::allocator<std::unique_ptr<int>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>, Hash = Hash, Eq = Eq, Alloc = std::allocator<std::unique_ptr<int>>]"
                       );
        }
        set_ctrl(this,pos,bVar4 & 0x7f);
        FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>::
        transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                  (local_50,this->slots_ + pos,this->slots_ + new_capacity);
        bVar4 = 0x80;
      }
      set_ctrl(this,new_capacity,bVar4);
    }
LAB_00120de7:
    new_capacity = new_capacity + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }